

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

DesugaredObject * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::DesugaredObject,jsonnet::internal::LocationRange&,std::__cxx11::list<jsonnet::internal::AST*,std::allocator<jsonnet::internal::AST*>>&,std::vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>&>
          (Allocator *this,LocationRange *args,
          list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *args_1,
          vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
          *args_2)

{
  DesugaredObject *this_00;
  Fields *in_RDX;
  ASTs *in_RSI;
  LocationRange *in_RDI;
  DesugaredObject *unaff_retaddr;
  DesugaredObject *r;
  
  this_00 = (DesugaredObject *)operator_new(0xb0);
  DesugaredObject::DesugaredObject(unaff_retaddr,in_RDI,in_RSI,in_RDX);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)this_00,
             (value_type *)this_00);
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }